

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O1

void __thiscall spdlog::details::file_helper::~file_helper(file_helper *this)

{
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,__IO_FILE_*)>
  *pfVar1;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pfVar2;
  _Manager_type p_Var3;
  pointer pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  FILE *local_10;
  
  if (this->fd_ != (FILE *)0x0) {
    if ((this->event_handlers_).before_close.super__Function_base._M_manager != (_Manager_type)0x0)
    {
      local_10 = this->fd_;
      (*(this->event_handlers_).before_close._M_invoker)
                ((_Any_data *)&(this->event_handlers_).before_close,&this->filename_,&local_10);
    }
    fclose((FILE *)this->fd_);
    this->fd_ = (FILE *)0x0;
    if ((this->event_handlers_).after_close.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->event_handlers_).after_close._M_invoker)
                ((_Any_data *)&(this->event_handlers_).after_close,&this->filename_);
    }
  }
  p_Var3 = (this->event_handlers_).after_close.super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    pfVar2 = &(this->event_handlers_).after_close;
    (*p_Var3)((_Any_data *)pfVar2,(_Any_data *)pfVar2,__destroy_functor);
  }
  p_Var3 = (this->event_handlers_).before_close.super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    pfVar1 = &(this->event_handlers_).before_close;
    (*p_Var3)((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  p_Var3 = (this->event_handlers_).after_open.super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    pfVar1 = &(this->event_handlers_).after_open;
    (*p_Var3)((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  p_Var3 = (this->event_handlers_).before_open.super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->event_handlers_,(_Any_data *)&this->event_handlers_,
              __destroy_functor);
  }
  pcVar4 = (this->filename_)._M_dataplus._M_p;
  paVar5 = &(this->filename_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar5) {
    operator_delete(pcVar4,paVar5->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

SPDLOG_INLINE file_helper::~file_helper() { close(); }